

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.hpp
# Opt level: O2

void __thiscall helics::apps::SineGenerator::SineGenerator(SineGenerator *this,string_view name)

{
  SignalGenerator::SignalGenerator(&this->super_SignalGenerator,name);
  (this->super_SignalGenerator)._vptr_SignalGenerator = (_func_int **)&PTR__SignalGenerator_004837b0
  ;
  this->level = 0.0;
  this->frequency = 0.0;
  this->offset = 0.0;
  this->amplitude = 0.0;
  this->dAdt = 0.0;
  this->dfdt = 0.0;
  this->period = 10000000.0;
  (this->lastCycle).internalTimeCode = 0;
  return;
}

Assistant:

explicit SineGenerator(std::string_view name): SignalGenerator(name) {}